

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

int main(int argc,char **argv)

{
  uint uVar1;
  t_machine *ptVar2;
  int iVar3;
  char *pcVar4;
  long lVar5;
  size_t sVar6;
  t_symbol *(*paptVar7) [256];
  FILE *pFVar8;
  FILE *__stream;
  int iVar9;
  long lVar10;
  long lVar11;
  char *pcVar12;
  bool bVar13;
  bool bVar14;
  undefined4 local_278;
  int cd_type;
  undefined8 local_270;
  option cmd_line_long_options [15];
  char cmd [80];
  
  cmd_line_long_options[0].name = "segment";
  cmd_line_long_options[0].has_arg = 0;
  cmd_line_long_options[0].flag = (int *)0x0;
  cmd_line_long_options[0].val = 0x73;
  cmd_line_long_options[1].name = "fullsegment";
  cmd_line_long_options[1].has_arg = 0;
  cmd_line_long_options[1].flag = (int *)0x0;
  cmd_line_long_options[1].val = 0x53;
  cmd_line_long_options[2].name = "listing";
  cmd_line_long_options[2].has_arg = 1;
  cmd_line_long_options[2].flag = (int *)0x0;
  cmd_line_long_options[2].val = 0x6c;
  cmd_line_long_options[3].name = "macro";
  cmd_line_long_options[3].has_arg = 0;
  cmd_line_long_options[3].flag = (int *)0x0;
  cmd_line_long_options[3].val = 0x6d;
  cmd_line_long_options[4].name = "raw";
  cmd_line_long_options[4].has_arg = 0;
  cmd_line_long_options[4].flag = &header_opt;
  cmd_line_long_options[4].val = 0;
  cmd_line_long_options[5].name = "cd";
  cmd_line_long_options[5].has_arg = 0;
  cmd_line_long_options[5].flag = &cd_type;
  cmd_line_long_options[6].name = "scd";
  cmd_line_long_options[6].has_arg = 0;
  cmd_line_long_options[6].val = 2;
  cmd_line_long_options[7].name = "over";
  cmd_line_long_options[7].has_arg = 0;
  cmd_line_long_options[7].flag = &overlayflag;
  cmd_line_long_options[8].name = "overlay";
  cmd_line_long_options[8].has_arg = 0;
  cmd_line_long_options[8].flag = &overlayflag;
  cmd_line_long_options[9].name = "dev";
  cmd_line_long_options[9].has_arg = 0;
  cmd_line_long_options[9].flag = &develo_opt;
  cmd_line_long_options[10].name = "develo";
  cmd_line_long_options[10].has_arg = 0;
  cmd_line_long_options[10].flag = &develo_opt;
  cmd_line_long_options[0xb].name = "mx";
  cmd_line_long_options[0xb].has_arg = 0;
  cmd_line_long_options[0xb].flag = &mx_opt;
  cmd_line_long_options[0xc].name = "srec";
  cmd_line_long_options[0xc].has_arg = 0;
  cmd_line_long_options[0xc].flag = &srec_opt;
  cmd_line_long_options[0xd].name = "help";
  cmd_line_long_options[0xd].has_arg = 0;
  cmd_line_long_options[0xd].flag = (int *)0x0;
  cmd_line_long_options[0xd].val = 0x68;
  cmd_line_long_options[0xe].flag = (int *)0x0;
  cmd_line_long_options[0xe].val = 0;
  cmd_line_long_options[0xe]._28_4_ = 0;
  cmd_line_long_options[0xe].name = (char *)0x0;
  cmd_line_long_options[0xe].has_arg = 0;
  cmd_line_long_options[0xe]._12_4_ = 0;
  cmd_line_long_options[5].val = cmd_line_long_options[2].has_arg;
  cmd_line_long_options[6].flag = cmd_line_long_options[5].flag;
  cmd_line_long_options[7].val = cmd_line_long_options[2].has_arg;
  cmd_line_long_options[8].val = cmd_line_long_options[2].has_arg;
  cmd_line_long_options[9].val = cmd_line_long_options[2].has_arg;
  cmd_line_long_options[10].val = cmd_line_long_options[2].has_arg;
  cmd_line_long_options[0xb].val = cmd_line_long_options[2].has_arg;
  cmd_line_long_options[0xc].val = cmd_line_long_options[2].has_arg;
  atexit(cleanup);
  prg_name = strrchr(*argv,0x2f);
  if ((prg_name == (char *)0x0) && (prg_name = strrchr(*argv,0x5c), prg_name == (char *)0x0)) {
    pcVar12 = *argv;
  }
  else {
    pcVar12 = prg_name + 1;
  }
  prg_name = pcVar12;
  pcVar4 = strrchr(pcVar12,0x2e);
  if (pcVar4 != (char *)0x0) {
    *pcVar4 = '\0';
    pcVar12 = prg_name;
  }
  iVar3 = strncasecmp(pcVar12,"PCE",3);
  overlayflag = 0;
  develo_opt = 0;
  mlist_opt = 0;
  srec_opt = 0;
  run_opt = 0;
  scd_opt = 0;
  cd_opt = 0;
  mx_opt = 0;
  machine = &nes;
  cd_type = 0;
  ptVar2 = &nes;
  if (iVar3 == 0) {
    machine = &pce;
  }
  list_level = 2;
  header_opt = 1;
  if (iVar3 == 0) {
    ptVar2 = &pce;
  }
  printf("%s\n\n",ptVar2->asm_title);
LAB_0010db46:
  do {
    iVar3 = getopt_long_only(argc,argv,"sSl:mhI:",cmd_line_long_options,&local_278);
    pcVar12 = _optarg;
    if (iVar3 < 1) {
      lVar5 = (long)_optind;
      if (_optind == argc) {
        fwrite("Missing input file\n",0x13,1,_stderr);
        return 0;
      }
      iVar3 = _optind + 1;
      for (lVar11 = 0; iVar9 = overlayflag, lVar5 + lVar11 < (long)argc; lVar11 = lVar11 + 1) {
        strcpy(in_fname,argv[lVar5 + lVar11]);
        _optind = iVar3 + (int)lVar11;
      }
      if (cd_type == 1) {
        scd_opt = 0;
        cd_opt = 1;
        bVar13 = true;
        bVar14 = false;
      }
      else if (cd_type == 2) {
        cd_opt = 0;
        scd_opt = 2;
        bVar14 = true;
        bVar13 = false;
      }
      else {
        bVar13 = scd_opt == 0;
        bVar14 = cd_opt == 0;
      }
      if (((overlayflag != 1) || (!bVar13)) || (!bVar14)) {
        if ((int)lVar11 == 0) goto LAB_0010dd05;
        pcVar12 = strrchr(in_fname,0x2e);
        if ((pcVar12 == (char *)0x0) || (pcVar4 = strchr(pcVar12,0x2f), pcVar4 != (char *)0x0)) {
          pcVar12 = (char *)0x0;
        }
        else {
          *pcVar12 = '\0';
          iVar9 = overlayflag;
        }
        strcpy(out_fname,in_fname);
        strcpy(bin_fname,in_fname);
        strcpy(lst_fname,in_fname);
        strcpy(sym_fname,in_fname);
        sVar6 = strlen(lst_fname);
        lst_fname[sVar6 + 4] = '\0';
        builtin_strncpy(lst_fname + sVar6,".lst",4);
        sVar6 = strlen(sym_fname);
        sym_fname[sVar6 + 4] = '\0';
        builtin_strncpy(sym_fname + sVar6,".sym",4);
        if (iVar9 == 1) {
          sVar6 = strlen(bin_fname);
          builtin_strncpy(bin_fname + sVar6,".ovl",4);
LAB_0010dded:
          bin_fname[sVar6 + 4] = '\0';
        }
        else {
          if (scd_opt != 0 || cd_opt != 0) {
            sVar6 = strlen(bin_fname);
            builtin_strncpy(bin_fname + sVar6,".iso",4);
            goto LAB_0010dded;
          }
          strcat(bin_fname,machine->rom_ext);
        }
        if (pcVar12 == (char *)0x0) {
          sVar6 = strlen(in_fname);
          builtin_strncpy(in_fname + sVar6,".asm",4);
          in_fname[sVar6 + 4] = '\0';
        }
        else {
          *pcVar12 = '.';
        }
        init_path();
        crc_init();
        iVar3 = open_input(in_fname);
        if (iVar3 != 0) {
          pcVar4 = "Can not open input file \'%s\'!\n";
          pcVar12 = in_fname;
LAB_0010e652:
          printf(pcVar4,pcVar12);
LAB_0010e63c:
          exit(1);
        }
        memset(rom,0xff,0x100000);
        memset(map,0xff,0x100000);
        for (lVar5 = 0; lVar5 != 0x800; lVar5 = lVar5 + 8) {
          *(undefined8 *)((long)hash_tbl + lVar5) = 0;
          *(undefined8 *)((long)macro_tbl + lVar5) = 0;
          *(undefined8 *)((long)func_tbl + lVar5) = 0;
          *(undefined8 *)((long)inst_tbl + lVar5) = 0;
        }
        local_278 = 0x100;
        addinst(base_inst);
        addinst(base_pseudo);
        addinst(machine->inst);
        addinst(machine->pseudo_inst);
        lablset("MAGICKIT",1);
        lablset("DEVELO",mx_opt | develo_opt);
        lablset("CDROM",scd_opt | cd_opt);
        lablset("_bss_end",0);
        lablset("_bank_base",0);
        lablset("_nb_bank",1);
        lablset("_call_bank",0);
        max_bank = 0;
        max_zp = 1;
        bank_base = 0;
        max_bss = 0x201;
        errcnt = 0;
        rom_limit = 0x100000;
        bank_limit = 0x7f;
        if (cd_opt == 0) {
          if (scd_opt == 0) {
            if (mx_opt != 0 || develo_opt != 0) {
              bank_limit = 0x17;
              rom_limit = 0x30000;
            }
          }
          else {
            bank_limit = 0x1f;
            rom_limit = 0x40000;
          }
        }
        else {
          bank_limit = 7;
          rom_limit = 0x10000;
        }
        local_270 = 0x11eda8;
        for (iVar3 = 0; pass = iVar3, iVar3 < 2; iVar3 = iVar3 + 1) {
          infile_error = -1;
          bank = 0;
          loccnt = 0;
          slnum = 0;
          mcounter = 0;
          mcntmax = 0;
          xlist = 0;
          glablptr = (t_symbol *)0x0;
          skip_lines = 0;
          rsbase = 0;
          proc_nb = 0;
          asm_opt[0] = 0;
          asm_opt[1] = mlist_opt;
          asm_opt[2] = 0;
          asm_opt[3] = 0;
          page = 7;
          paptVar7 = bank_glabl;
          lVar5 = 0;
          for (lVar11 = 0; ptVar2 = machine, lVar11 != 4; lVar11 = lVar11 + 1) {
            for (lVar10 = 0; lVar10 != 0x400; lVar10 = lVar10 + 4) {
              *(undefined4 *)((long)bank_loccnt[0] + lVar5 + lVar10) = 0;
              *(undefined8 *)((long)*paptVar7 + lVar10 * 2) = 0;
              *(undefined4 *)((long)bank_page[0] + lVar5 + lVar10) = 0;
            }
            lVar5 = lVar5 + 0x400;
            paptVar7 = paptVar7 + 1;
          }
          local_278 = 4;
          uVar1 = machine->ram_bank;
          section = 2;
          section_bank[0] = uVar1;
          bank_page[0][(int)uVar1] = machine->ram_page;
          bank_loccnt[0][(int)uVar1] = 0;
          section_bank[1] = uVar1;
          bank_page[1][(int)uVar1] = ptVar2->ram_page;
          bank_loccnt[1][(int)uVar1] = 0x200;
          section_bank[2] = 0;
          section_bank[3] = 0;
          bank_page[2][0] = 7;
          bank_loccnt[2][0] = 0;
          bank_loccnt[3][0] = 0;
          bank_page[3][0] = bank_page[2][0];
          printf("pass %i\n",(ulong)(iVar3 + 1));
          do {
            iVar3 = readline();
            if (iVar3 == -1) break;
            assemble();
            if (0x2000 < loccnt) {
              loccnt = loccnt & 0x1fff;
              page = page + 1;
              bank = bank + 1;
              if (pass == 0) {
                printf("   (Warning. Opcode crossing page boundary $%04X, bank $%02X)\n",
                       (ulong)(uint)(page * 0x2000));
              }
            }
          } while (stop_pass == 0);
          if (pass == 0) {
            proc_reloc();
          }
          if (errcnt != 0) {
            printf("# %d error(s)\n");
            goto LAB_0010e63c;
          }
          if (pass == 0) {
            bank_base = calc_bank_base();
            lablset("_bss_end",max_bss + machine->ram_base);
            lablset("_bank_base",bank_base);
            lablset("_call_bank",bank_base + max_bank + 1);
            lablset("_nb_bank",max_bank + 2);
            if ((pass == 0) &&
               (((develo_opt != 0 || (mx_opt != 0)) || ((cd_opt != 0 || (scd_opt != 0)))))) {
              lablremap();
            }
          }
          rewind((FILE *)in_fp);
          iVar3 = pass;
          if (((pass == 0) && (iVar3 = 0, xlist != 0)) && (list_level != 0)) {
            lst_fp = (FILE *)fopen(lst_fname,"w");
            if ((FILE *)lst_fp == (FILE *)0x0) {
              pcVar4 = "Can not open listing file \'%s\'!\n";
              pcVar12 = lst_fname;
              goto LAB_0010e652;
            }
            fprintf((FILE *)lst_fp,"#[1]   %s\n",local_270);
            iVar3 = pass;
          }
        }
        if (errcnt != 0) goto LAB_0010e5c0;
        if (scd_opt == 0 && cd_opt == 0) {
          if (mx_opt != 0 || develo_opt != 0) {
            page = (int)(map[0][0] >> 5);
            iVar3 = 0xd0000;
            if (max_bank + page < 7) {
              iVar3 = page << 0xd;
            }
            write_srec(out_fname,"mx",iVar3);
            if (develo_opt != 0) {
              sprintf(cmd,"perun %s",out_fname);
              system(cmd);
            }
            goto LAB_0010e5c0;
          }
          if (srec_opt != 0) {
            write_srec(out_fname,"s28",0);
            goto LAB_0010e5c0;
          }
          pFVar8 = fopen(bin_fname,"wb");
          if (pFVar8 == (FILE *)0x0) {
            pcVar4 = "Can not open binary file \'%s\'!\n";
            goto LAB_0010e672;
          }
          if (header_opt != 0) {
            (*machine->write_header)((FILE *)pFVar8,max_bank + 1);
          }
          fwrite(rom,0x2000,(long)max_bank + 1,pFVar8);
        }
        else {
          pFVar8 = fopen(bin_fname,"wb");
          if (pFVar8 == (FILE *)0x0) {
            pcVar4 = "Can not open output file \'%s\'!\n";
LAB_0010e672:
            pcVar12 = bin_fname;
            goto LAB_0010e652;
          }
          if ((header_opt != 0) && (overlayflag == 0)) {
            __stream = (FILE *)open_file("ipl.bin","rb");
            if (__stream == (FILE *)0x0) {
              puts("Can not find CD boot file \'ipl.bin\'!");
              goto LAB_0010e63c;
            }
            fread(ipl_buffer,1,0x1000,__stream);
            fclose(__stream);
            ipl_buffer[0x810] = '\0';
            ipl_buffer[0x811] = '\0';
            ipl_buffer[0x812] = '\0';
            ipl_buffer[0x813] = '\0';
            ipl_buffer[0x814] = '\0';
            ipl_buffer[0x815] = '\0';
            ipl_buffer[0x816] = '\0';
            ipl_buffer[0x817] = '\0';
            ipl_buffer[0x818] = '\0';
            ipl_buffer[0x819] = '\0';
            ipl_buffer[0x81a] = '\0';
            ipl_buffer[0x81b] = '\0';
            ipl_buffer[0x81c] = '\0';
            ipl_buffer[0x81d] = '\0';
            ipl_buffer[0x81e] = '\0';
            ipl_buffer[0x81f] = '\0';
            ipl_buffer[0x800] = '\0';
            ipl_buffer[0x801] = '\0';
            ipl_buffer[0x802] = '\x02';
            ipl_buffer[0x803] = '\x10';
            ipl_buffer[0x804] = '\0';
            ipl_buffer[0x805] = '@';
            ipl_buffer[0x806] = 'p';
            ipl_buffer[0x807] = '@';
            ipl_buffer[0x808] = '\0';
            ipl_buffer[0x809] = '\x01';
            ipl_buffer[0x80a] = '\x02';
            ipl_buffer[0x80b] = '\x03';
            ipl_buffer[0x80c] = '\0';
            ipl_buffer[0x80d] = '`';
            ipl_buffer[0x80e] = '\0';
            ipl_buffer[0x80f] = '\0';
            fwrite(ipl_buffer,1,0x1000,pFVar8);
          }
          fwrite(rom,0x2000,(long)max_bank + 1,pFVar8);
          if (overlayflag == 0) {
            memset(zeroes,0,0x800);
            iVar3 = max_bank * -4 + 0x1bc;
            zero_need = 0x96;
            if (0x96 < iVar3) {
              zero_need = iVar3;
            }
            for (; 0 < zero_need; zero_need = zero_need + -1) {
              fwrite(zeroes,1,0x800,pFVar8);
            }
          }
        }
        fclose(pFVar8);
LAB_0010e5c0:
        if ((xlist != 0) && (list_level != 0)) {
          fclose((FILE *)lst_fp);
        }
        fclose((FILE *)in_fp);
        pFVar8 = fopen(sym_fname,"w");
        if (pFVar8 != (FILE *)0x0) {
          labldump((FILE *)pFVar8);
          fclose(pFVar8);
        }
        if (dump_seg != 0) {
          show_seg_usage();
          return 0;
        }
        return 0;
      }
      puts("Overlay option only valid for CD or SCD programs\n");
LAB_0010dd05:
      help();
      return 0;
    }
    if (iVar3 != 0x49) {
      if (iVar3 == 0x53) {
        dump_seg = 2;
      }
      else if (iVar3 == 0x6c) {
        lVar5 = atol(_optarg);
        list_level = (int)lVar5;
        if (3 < (uint)list_level) {
          list_level = 2;
        }
      }
      else if (iVar3 == 0x6d) {
        mlist_opt = 1;
      }
      else {
        if (iVar3 != 0x73) {
          if (iVar3 != 0x68) {
            return 1;
          }
          goto LAB_0010dd05;
        }
        dump_seg = 1;
      }
      goto LAB_0010db46;
    }
    sVar6 = strlen(_optarg);
    iVar3 = add_path(pcVar12,(int)sVar6 + 1);
    if (iVar3 == 0) {
      puts("Error while adding include path");
      return 0;
    }
  } while( true );
}

Assistant:

int
main(int argc, char **argv)
{
	FILE *fp, *ipl;
	char *p;
	char  cmd[80];
	int i, j, opt;
	int file;
	int ram_bank;
	int cd_type;
	const char *cmd_line_options = "sSl:mhI:";
	const struct option cmd_line_long_options[] = {
		{"segment",     0, 0,		's'},
		{"fullsegment", 0, 0,		'S'},
		{"listing",	1, 0,		'l'},
		{"macro",       0, 0, 		'm'},
		{"raw",		0, &header_opt,  0 },
		{"cd",		0, &cd_type,	 1 },
		{"scd",		0, &cd_type,	 2 },
		{"over",	0, &overlayflag, 1 },
		{"overlay",	0, &overlayflag, 1 },
		{"dev",		0, &develo_opt,  1 },
		{"develo",	0, &develo_opt,  1 },			
		{"mx",		0, &mx_opt, 	 1 },
		{"srec",	0, &srec_opt, 	 1 },
		{"help",	0, 0,		'h'},
		{0,		0, 0,		 0 }
	};

	/* register atexit callback */
	atexit(cleanup);
	
	/* get program name */
	if ((prg_name = strrchr(argv[0], '/')) != NULL)
		 prg_name++;
	else {
		if ((prg_name = strrchr(argv[0], '\\')) == NULL)
			 prg_name = argv[0];
		else
			 prg_name++;
	}

	/* remove extension */
	if ((p = strrchr(prg_name, '.')) != NULL)
		*p = '\0';

	/* machine detection */
	if (!strncasecmp(prg_name, "PCE", 3))
		machine = &pce;     //change this to &nes to build NESASM
	else
		machine = &nes;

	/* init assembler options */
	list_level = 2;
	header_opt = 1;
	overlayflag = 0;
	develo_opt = 0;
	mlist_opt = 0;
	srec_opt = 0;
	run_opt = 0;
	scd_opt = 0;
	cd_opt = 0;
	mx_opt = 0;
	file = 0;
	cd_type = 0;
	
	/* display assembler version message */
	printf("%s\n\n", machine->asm_title);
	
	while ((opt = getopt_long_only (argc, argv, cmd_line_options, cmd_line_long_options, &i)) > 0)
	{
		switch(opt)
		{	
			case 's':
				dump_seg = 1;
				break;
				
			case 'S':
				dump_seg = 2;
				break;
			
			case 'l':
				/* get level */
				list_level = atol(optarg);
				
				/* check range */
				if (list_level < 0 || list_level > 3)
					list_level = 2;
				break;
			
			case 'm':
				mlist_opt = 1;
				break;
				
			case 'I':
				if(!add_path(optarg, strlen(optarg)+1))
				{
					printf("Error while adding include path\n");
					return 0;
				}
				break;
				
			case 'h':
				help();
				return 0;
				
			default:
				return 1;
		}		
	}

	/* check for missing asm file */
	if(optind == argc)
	{
		fprintf(stderr, "Missing input file\n");
		return 0;
	}
	
	/* get file names */
	for ( ; optind < argc; ++optind, ++file) {
		strcpy(in_fname, argv[optind]);
	}

	/* Adjust cdrom type values ... */
	switch(cd_type) {
		case 1:
			/* cdrom */	
			cd_opt  = STANDARD_CD;
			scd_opt = 0;
			break;
			
		case 2:
			/* super cdrom */
			scd_opt = SUPER_CD;
			cd_opt  = 0;
			break;
	}

	if ( (overlayflag == 1) &&
	     ((scd_opt == 0) && (cd_opt == 0)) )
	{
		printf("Overlay option only valid for CD or SCD programs\n\n");
		help();
		return (0);
	}

	if (!file) {
		help();
		return (0);
	}

	/* search file extension */
	if ((p = strrchr(in_fname, '.')) != NULL) {
		if (!strchr(p, PATH_SEPARATOR))
		   *p = '\0';
		else
			p = NULL;
	}

	/* auto-add file extensions */
	strcpy(out_fname, in_fname);
	strcpy(bin_fname, in_fname);
	strcpy(lst_fname, in_fname);
	strcpy(sym_fname, in_fname);
	strcat(lst_fname, ".lst");
	strcat(sym_fname, ".sym");

	if (overlayflag == 1)
		strcat(bin_fname, ".ovl");
	else if (cd_opt || scd_opt)
		strcat(bin_fname, ".iso");
	else
		strcat(bin_fname, machine->rom_ext);

	if (p)
	   *p = '.';
	else
		strcat(in_fname, ".asm");

	/* init include path */
	init_path();

	/* init crc functions */
	crc_init();

	/* open the input file */
	if (open_input(in_fname)) {
		printf("Can not open input file '%s'!\n", in_fname);
		exit(1);
	}

	/* clear the ROM array */
	memset(rom, 0xFF, 8192 * 128);
	memset(map, 0xFF, 8192 * 128);

	/* clear symbol hash tables */
	for (i = 0; i < 256; i++) {
		hash_tbl[i]  = NULL;
		macro_tbl[i] = NULL;
		func_tbl[i]  = NULL;
		inst_tbl[i]  = NULL;
	}

	/* fill the instruction hash table */
	addinst(base_inst);
	addinst(base_pseudo);

	/* add machine specific instructions and pseudos */
	addinst(machine->inst);
	addinst(machine->pseudo_inst);

	/* predefined symbols */
	lablset("MAGICKIT", 1);
	lablset("DEVELO", develo_opt | mx_opt);
	lablset("CDROM", cd_opt | scd_opt);
	lablset("_bss_end", 0);
	lablset("_bank_base", 0);
	lablset("_nb_bank", 1);
	lablset("_call_bank", 0);

	/* init global variables */
	max_zp = 0x01;
	max_bss = 0x0201;
	max_bank = 0;
	rom_limit = 0x100000;		/* 1MB */
	bank_limit = 0x7F;
	bank_base = 0;
	errcnt = 0;

	if (cd_opt) {
		rom_limit  = 0x10000;	/* 64KB */
		bank_limit = 0x07;
	}
	else if (scd_opt) {
		rom_limit  = 0x40000;	/* 256KB */
		bank_limit = 0x1F;
	}
	else if (develo_opt || mx_opt) {
		rom_limit  = 0x30000;	/* 192KB */
		bank_limit = 0x17;
	}

	/* assemble */
	for (pass = FIRST_PASS; pass <= LAST_PASS; pass++) {
		infile_error = -1;
		page = 7;
		bank = 0;
		loccnt = 0;
		slnum = 0;
		mcounter = 0;
		mcntmax = 0;
		xlist = 0;
		glablptr = NULL;
		skip_lines = 0;
		rsbase = 0;
		proc_nb = 0;

		/* reset assembler options */
		asm_opt[OPT_LIST] = 0;
		asm_opt[OPT_MACRO] = mlist_opt;
		asm_opt[OPT_WARNING] = 0;
		asm_opt[OPT_OPTIMIZE] = 0;

		/* reset bank arrays */
		for (i = 0; i < 4; i++) {
			for (j = 0; j < 256; j++) {
				bank_loccnt[i][j] = 0;
				bank_glabl[i][j]  = NULL;
				bank_page[i][j]   = 0;
			}
		}

		/* reset sections */
		ram_bank = machine->ram_bank;
		section  = S_CODE;

		/* .zp */
		section_bank[S_ZP]           = ram_bank;
		bank_page[S_ZP][ram_bank]    = machine->ram_page;
		bank_loccnt[S_ZP][ram_bank]  = 0x0000;

		/* .bss */
		section_bank[S_BSS]          = ram_bank;
		bank_page[S_BSS][ram_bank]   = machine->ram_page;
		bank_loccnt[S_BSS][ram_bank] = 0x0200;

		/* .code */
		section_bank[S_CODE]         = 0x00;
		bank_page[S_CODE][0x00]      = 0x07;
		bank_loccnt[S_CODE][0x00]    = 0x0000;

		/* .data */
		section_bank[S_DATA]         = 0x00;
		bank_page[S_DATA][0x00]      = 0x07;
		bank_loccnt[S_DATA][0x00]    = 0x0000;

		/* pass message */
		printf("pass %i\n", pass + 1);

		/* assemble */
		while (readline() != -1) {
			assemble();
			if (loccnt > 0x2000) {
				loccnt&=0x1fff;
				page++;
				bank++;
				if(pass==FIRST_PASS)
				printf("   (Warning. Opcode crossing page boundary $%04X, bank $%02X)\n",(page*0x2000),bank);
			}
			if (stop_pass)
				break;
		}

		/* relocate procs */
		if (pass == FIRST_PASS)
			proc_reloc();

		/* abord pass on errors */
		if (errcnt) {
			printf("# %d error(s)\n", errcnt);
			exit(1);
			//break;
		}

		/* adjust bank base */
		if (pass == FIRST_PASS)
			bank_base = calc_bank_base();

		/* update predefined symbols */
		if (pass == FIRST_PASS) {
			lablset("_bss_end", machine->ram_base + max_bss);
			lablset("_bank_base", bank_base);
			lablset("_call_bank", bank_base + max_bank + 1);
			lablset("_nb_bank", max_bank + 2);
		}

		/* adjust the symbol table for the develo or for cd-roms */
		if (pass == FIRST_PASS) {
			if (develo_opt || mx_opt || cd_opt || scd_opt)
				lablremap();
		}

		/* rewind input file */
		rewind(in_fp);

		/* open the listing file */
		if (pass == FIRST_PASS) {
			if (xlist && list_level) {
				if ((lst_fp = fopen(lst_fname, "w")) == NULL) {
					printf("Can not open listing file '%s'!\n", lst_fname);
					exit(1);
				}
				fprintf(lst_fp, "#[1]   %s\n", input_file[1].name);
			}
		}
	}

	/* rom */
	if (errcnt == 0) {
		/* cd-rom */
		if (cd_opt || scd_opt) {
			/* open output file */
			if ((fp = fopen(bin_fname, "wb")) == NULL) {
				printf("Can not open output file '%s'!\n", bin_fname);
				exit(1);
			}

			/* boot code */
			if ((header_opt) && (overlayflag == 0)) {
				/* open ipl binary file */
				if ((ipl = open_file("ipl.bin", "rb")) == NULL) {
					printf("Can not find CD boot file 'ipl.bin'!\n");
					exit(1);
				}

				/* load ipl */
				fread(ipl_buffer, 1, 4096, ipl);
				fclose(ipl);

				memset(&ipl_buffer[0x800], 0, 32);
				/* prg sector base */
				ipl_buffer[0x802] = 2;
				/* nb sectors */
				ipl_buffer[0x803] = 16;
				/* loading address */
				ipl_buffer[0x804] = 0x00;
				ipl_buffer[0x805] = 0x40;
				/* starting address */
				ipl_buffer[0x806] = BOOT_ENTRY_POINT & 0xFF;
				ipl_buffer[0x807] = (BOOT_ENTRY_POINT >> 8) & 0xFF;
				/* mpr registers */
				ipl_buffer[0x808] = 0x00;
				ipl_buffer[0x809] = 0x01;
				ipl_buffer[0x80A] = 0x02;
				ipl_buffer[0x80B] = 0x03;
				ipl_buffer[0x80C] = 0x00;	/* boot loader @ $C000 */
				/* load mode */
				ipl_buffer[0x80D] = 0x60;

				/* write boot code */
				fwrite(ipl_buffer, 1, 4096, fp);
			}

			/* write rom */
			fwrite(rom, 8192, (max_bank + 1), fp);

			/* write trailing zeroes to fill */
			/* at least 4 seconds of CDROM */
			if (overlayflag == 0)
			{
				memset(zeroes, 0, 2048);

				/* calculate number of trailing zero sectors      */
				/* rule 1: track must be at least 6 seconds total */
				zero_need = (6*75) - 2 - (4 * (max_bank + 1));

				/* rule 2: track should have at least 2 seconds     */
				/*         of trailing zeroes before an audio track */
				if (zero_need < (2*75))
					zero_need = (2*75);

				while (zero_need > 0) {
					fwrite(zeroes, 1, 2048, fp);
					zero_need--;
				}
			}

			fclose(fp);
		}

		/* develo box */
		else if (develo_opt || mx_opt) {
			page = (map[0][0] >> 5);

			/* save mx file */
			if ((page + max_bank) < 7)
				/* old format */
				write_srec(out_fname, "mx", page << 13);
			else
				/* new format */
				write_srec(out_fname, "mx", 0xD0000);

			/* execute */
			if (develo_opt) {
				sprintf(cmd, "perun %s", out_fname);
				system(cmd);
			}
		}

		/* save */
		else {
			/* s-record file */
			if (srec_opt)
				write_srec(out_fname, "s28", 0);

			/* binary file */
			else {
				/* open file */
				if ((fp = fopen(bin_fname, "wb")) == NULL) {
					printf("Can not open binary file '%s'!\n", bin_fname);
					exit(1);
				}

				/* write header */
				if (header_opt)
					machine->write_header(fp, max_bank + 1);

				/* write rom */
				fwrite(rom, 8192, (max_bank + 1), fp);
				fclose(fp);
			}
		}
	}

	/* close listing file */
	if (xlist && list_level)
		fclose(lst_fp);

	/* close input file */
	fclose(in_fp);

	/* dump the symbol table */
	if ((fp = fopen(sym_fname, "w")) != NULL) {
		labldump(fp);
		fclose(fp);
	}

	/* dump the bank table */
	if (dump_seg)
		show_seg_usage();

	/* ok */
	return(0);
}